

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O2

void __thiscall pybind11::buffer_info::~buffer_info(buffer_info *this)

{
  if ((*(long *)(this + 0x70) != 0) && (this[0x78] == (buffer_info)0x1)) {
    PyBuffer_Release();
    operator_delete(*(void **)(this + 0x70));
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)(this + 0x58));
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)(this + 0x40));
  std::__cxx11::string::~string((string *)(this + 0x18));
  return;
}

Assistant:

~buffer_info() {
        if (view && ownview) { PyBuffer_Release(view); delete view; }
    }